

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O0

void __thiscall Rml::DataViewIf::DataViewIf(DataViewIf *this,Element *element)

{
  String local_38;
  Element *local_18;
  Element *element_local;
  DataViewIf *this_local;
  
  local_18 = element;
  element_local = (Element *)this;
  ::std::__cxx11::string::string((string *)&local_38);
  DataViewCommon::DataViewCommon(&this->super_DataViewCommon,element,&local_38,0);
  ::std::__cxx11::string::~string((string *)&local_38);
  (this->super_DataViewCommon).super_DataView.super_Releasable._vptr_Releasable =
       (_func_int **)&PTR__DataViewIf_008155c8;
  return;
}

Assistant:

DataViewIf::DataViewIf(Element* element) : DataViewCommon(element) {}